

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ParsePolyLineVertex(DXFImporter *this,LineReader *reader,PolyLine *line)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  string *__lhs;
  ulong uVar4;
  Logger *pLVar5;
  reference pvVar6;
  value_type_conflict1 local_5c;
  uint local_58;
  undefined1 auStack_54 [4];
  uint i;
  aiColor4D clr;
  aiVector3D out;
  uint indices [4];
  uint flags;
  uint cnti;
  PolyLine *line_local;
  LineReader *reader_local;
  DXFImporter *this_local;
  
  indices[3] = 0;
  indices[2] = 0;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&clr.b);
  auStack_54 = (undefined1  [4])AI_DXF_DEFAULT_COLOR.r;
  i = (uint)AI_DXF_DEFAULT_COLOR.g;
  clr.r = AI_DXF_DEFAULT_COLOR.b;
  clr.g = AI_DXF_DEFAULT_COLOR.a;
  while ((bVar1 = DXF::LineReader::End(reader), ((bVar1 ^ 0xffU) & 1) != 0 &&
         (bVar1 = DXF::LineReader::Is(reader,0), !bVar1))) {
    iVar2 = DXF::LineReader::GroupCode(reader);
    switch(iVar2) {
    case 8:
      __lhs = DXF::LineReader::Value_abi_cxx11_(reader);
      bVar1 = std::operator!=(__lhs,&line->layer);
      if (bVar1) {
        pLVar5 = DefaultLogger::get();
        Logger::warn(pLVar5,
                     "DXF: expected vertex to be part of a poly-face but the 0x128 flag isn\'t set")
        ;
      }
      break;
    case 10:
      clr.b = DXF::LineReader::ValueAsFloat(reader);
      break;
    case 0x14:
      clr.a = DXF::LineReader::ValueAsFloat(reader);
      break;
    case 0x1e:
      DXF::LineReader::ValueAsFloat(reader);
      break;
    case 0x3e:
      uVar3 = DXF::LineReader::ValueAsUnsignedInt(reader);
      auStack_54 = (undefined1  [4])g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].r;
      i = (uint)g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].g;
      clr.r = g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].b;
      clr.g = g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].a;
      break;
    case 0x46:
      indices[2] = DXF::LineReader::ValueAsUnsignedInt(reader);
      break;
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
      if (indices[3] == 4) {
        pLVar5 = DefaultLogger::get();
        Logger::warn(pLVar5,"DXF: more than 4 indices per face not supported; ignoring");
      }
      else {
        uVar3 = DXF::LineReader::ValueAsUnsignedInt(reader);
        uVar4 = (ulong)indices[3];
        indices[3] = indices[3] + 1;
        indices[uVar4 - 2] = uVar3;
      }
    }
    DXF::LineReader::operator++(reader,0);
  }
  if (((line->flags & 0x40) != 0) && ((indices[2] & 0x80) == 0)) {
    pLVar5 = DefaultLogger::get();
    Logger::warn(pLVar5,
                 "DXF: expected vertex to be part of a polyface but the 0x128 flag isn\'t set");
  }
  if (indices[3] == 0) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&line->positions,(value_type *)&clr.b);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
              (&line->colors,(value_type *)auStack_54);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&line->counts,indices + 3);
    for (local_58 = 0; local_58 < indices[3]; local_58 = local_58 + 1) {
      if (indices[(ulong)local_58 - 2] == 0) {
        pLVar5 = DefaultLogger::get();
        Logger::warn(pLVar5,"DXF: invalid vertex index, indices are one-based.");
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&line->counts);
        *pvVar6 = *pvVar6 - 1;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&line->counts);
        if (*pvVar6 == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&line->counts);
        }
      }
      else {
        local_5c = indices[(ulong)local_58 - 2] - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&line->indices,&local_5c);
      }
    }
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLineVertex(DXF::LineReader& reader, DXF::PolyLine& line) {
    unsigned int cnti = 0, flags = 0;
    unsigned int indices[4];

    aiVector3D out;
    aiColor4D clr = AI_DXF_DEFAULT_COLOR;

    while( !reader.End() ) {

        if (reader.Is(0)) { // SEQEND or another VERTEX
            break;
        }

        switch (reader.GroupCode()) {
        case 8:
                // layer to which the vertex belongs to - assume that
                // this is always the layer the top-level poly-line
                // entity resides on as well.
                if(reader.Value() != line.layer) {
                    ASSIMP_LOG_WARN("DXF: expected vertex to be part of a poly-face but the 0x128 flag isn't set");
                }
                break;

        case 70:
                flags = reader.ValueAsUnsignedInt();
                break;

        // VERTEX COORDINATES
        case GroupCode_XComp:
            out.x = reader.ValueAsFloat();
            break;

        case GroupCode_YComp:
            out.y = reader.ValueAsFloat();
            break;

        case GroupCode_ZComp:
            out.z = reader.ValueAsFloat();
            break;

        // POLYFACE vertex indices
        case 71:
        case 72:
        case 73:
        case 74:
            if (cnti == 4) {
                ASSIMP_LOG_WARN("DXF: more than 4 indices per face not supported; ignoring");
                break;
            }
            indices[cnti++] = reader.ValueAsUnsignedInt();
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        reader++;
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH && !(flags & DXF_VERTEX_FLAG_PART_OF_POLYFACE)) {
        ASSIMP_LOG_WARN("DXF: expected vertex to be part of a polyface but the 0x128 flag isn't set");
    }

    if (cnti) {
        line.counts.push_back(cnti);
        for (unsigned int i = 0; i < cnti; ++i) {
            // IMPORTANT NOTE: POLYMESH indices are ONE-BASED
            if (indices[i] == 0) {
                ASSIMP_LOG_WARN("DXF: invalid vertex index, indices are one-based.");
                --line.counts.back();
                // Workaround to fix issue 2229
                if (line.counts.back() == 0) {
                    line.counts.pop_back();
                }
                continue;
            }
            line.indices.push_back(indices[i]-1);
        }
    } else {
        line.positions.push_back(out);
        line.colors.push_back(clr);
    }
}